

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O3

int dwarf_get_ATCF_name(uint val,char **s_out)

{
  char *pcVar1;
  
  switch(val) {
  case 0x40:
    pcVar1 = "DW_ATCF_lo_user";
    break;
  case 0x41:
    pcVar1 = "DW_ATCF_SUN_mop_bitfield";
    break;
  case 0x42:
    pcVar1 = "DW_ATCF_SUN_mop_spill";
    break;
  case 0x43:
    pcVar1 = "DW_ATCF_SUN_mop_scopy";
    break;
  case 0x44:
    pcVar1 = "DW_ATCF_SUN_func_start";
    break;
  case 0x45:
    pcVar1 = "DW_ATCF_SUN_end_ctors";
    break;
  case 0x46:
    pcVar1 = "DW_ATCF_SUN_branch_target";
    break;
  case 0x47:
    pcVar1 = "DW_ATCF_SUN_mop_stack_probe";
    break;
  case 0x48:
    pcVar1 = "DW_ATCF_SUN_func_epilog";
    break;
  default:
    if (val != 0xff) {
      return -1;
    }
    pcVar1 = "DW_ATCF_hi_user";
  }
  *s_out = pcVar1;
  return 0;
}

Assistant:

int
dwarf_get_ATCF_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ATCF_lo_user:
        *s_out = "DW_ATCF_lo_user";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_bitfield:
        *s_out = "DW_ATCF_SUN_mop_bitfield";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_spill:
        *s_out = "DW_ATCF_SUN_mop_spill";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_scopy:
        *s_out = "DW_ATCF_SUN_mop_scopy";
        return DW_DLV_OK;
    case DW_ATCF_SUN_func_start:
        *s_out = "DW_ATCF_SUN_func_start";
        return DW_DLV_OK;
    case DW_ATCF_SUN_end_ctors:
        *s_out = "DW_ATCF_SUN_end_ctors";
        return DW_DLV_OK;
    case DW_ATCF_SUN_branch_target:
        *s_out = "DW_ATCF_SUN_branch_target";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_stack_probe:
        *s_out = "DW_ATCF_SUN_mop_stack_probe";
        return DW_DLV_OK;
    case DW_ATCF_SUN_func_epilog:
        *s_out = "DW_ATCF_SUN_func_epilog";
        return DW_DLV_OK;
    case DW_ATCF_hi_user:
        *s_out = "DW_ATCF_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}